

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O3

bool __thiscall
llbuild::commands::executeNinjaBuildCommand(std::vector<std::__cxx11::string,std::allocator<std::
__cxx11::string>>)::NinjaCompositeResultRule::isResultValid(llbuild::core::BuildEngine&,std::
vector<unsigned_char,std::allocator<unsigned_char>_>_const__
          (void *this,BuildEngine *param_1,ValueType *value)

{
  long lVar1;
  hash_code hVar2;
  size_t extraout_RDX;
  bool bVar3;
  StringRef S;
  BuildValue value_1;
  BuildValue local_70;
  
  bVar3 = true;
  if (*(char *)(*(long *)((long)this + 0x30) + 0x91) == '\0') {
    lVar1 = *(long *)((long)this + 0x38);
    anon_unknown.dwarf_b0fca::BuildValue::fromValue
              (&local_70,
               (BuildValue *)
               (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (ValueType *)
               (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    if (local_70.kind == SuccessfulCommand) {
      S.Length = extraout_RDX;
      S.Data = *(char **)(lVar1 + 0x78);
      hVar2 = llvm::hash_value(*(llvm **)(lVar1 + 0x70),S);
      bVar3 = local_70.commandHash.value == hVar2.value;
    }
    else {
      bVar3 = false;
    }
    if ((FileInfo *)local_70.valueData.asOutputInfo.device != (FileInfo *)0x0 &&
        1 < local_70.numOutputInfos) {
      operator_delete__(local_70.valueData.asOutputInfos);
    }
  }
  return bVar3;
}

Assistant:

bool isResultValid(core::BuildEngine&, const core::ValueType& value) override {
        // If simulating, assume cached results are valid.
        if (context.simulate)
          return true;

        return selectCompositeIsResultValid(command, value);
      }